

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void remove_monster(level *lev,int x,int y)

{
  monst *pmVar1;
  monst **ppmVar2;
  
  ppmVar2 = lev->monsters[x] + y;
  pmVar1 = *ppmVar2;
  if (((pmVar1 != (monst *)0x0) && (pmVar1->data == (permonst *)0x304df0)) &&
     (((pmVar1->field_0x60 & 2) == 0 ||
      (((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)) ||
       (((youmonst.data)->mflags1 & 0x1000000) != 0)))))) {
    unblock_point(x,y);
  }
  *ppmVar2 = (monst *)0x0;
  return;
}

Assistant:

void remove_monster(struct level *lev, int x, int y)
{
	struct monst *m = lev->monsters[x][y];
	if (m &&
	    (m->data == &mons[PM_GIANT_TURTLE] &&
	     (!m->minvis || See_invisible)))
	    unblock_point(x, y);
	lev->monsters[x][y] = NULL;
}